

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ChainstateManager::GenerateCoinbaseCommitment
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  pointer puVar1;
  pointer puVar2;
  pointer pCVar3;
  Span<const_unsigned_char> input;
  Span<const_unsigned_char> input_00;
  Span<unsigned_char> output;
  int iVar4;
  uchar *puVar5;
  CMutableTransaction *this_00;
  iterator tx_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  int commitpos;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment;
  CMutableTransaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  CTxOut out;
  uint256 witnessroot;
  CMutableTransaction *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffda8;
  allocator_type *in_stack_fffffffffffffdb0;
  CBlock *in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdc0;
  size_type new_size;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffdc8;
  CBlockIndex *in_stack_fffffffffffffdd8;
  iterator in_stack_fffffffffffffde0;
  iterator in_stack_fffffffffffffde8;
  bool *in_stack_fffffffffffffdf0;
  CBlock *in_stack_fffffffffffffdf8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_128 [2];
  undefined1 local_d9;
  undefined8 local_c0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd98);
  iVar4 = GetWitnessCommitmentIndex(in_stack_fffffffffffffdb8);
  local_d9 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc0,(value_type_conflict *)in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb0);
  new_size = (size_type)(in_stack_fffffffffffffdc0 >> 0x20);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd98);
  if (iVar4 == -1) {
    BlockWitnessMerkleRoot(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_38 = 0;
    CHash256::CHash256((CHash256 *)in_stack_fffffffffffffd98);
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffda8,
               (uint256 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    input.m_size = (size_t)in_stack_fffffffffffffdb8;
    input.m_data = (uchar *)in_stack_fffffffffffffdb0;
    CHash256::Write((CHash256 *)in_stack_fffffffffffffda8,input);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffda8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    input_00.m_size = (size_t)in_stack_fffffffffffffdb8;
    input_00.m_data = (uchar *)in_stack_fffffffffffffdb0;
    CHash256::Write((CHash256 *)in_stack_fffffffffffffda8,input_00);
    Span<unsigned_char>::Span<uint256>
              ((Span<unsigned_char> *)in_stack_fffffffffffffda8,
               (uint256 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    output.m_size = (size_t)in_stack_fffffffffffffdb8;
    output.m_data = (uchar *)in_stack_fffffffffffffdb0;
    CHash256::Finalize((CHash256 *)in_stack_fffffffffffffda8,output);
    CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffffdb8);
    local_c0 = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(in_stack_fffffffffffffdc8,new_size);
    puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *puVar5 = 'j';
    puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *puVar5 = '$';
    puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *puVar5 = 0xaa;
    in_stack_fffffffffffffde8.ptr =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                   (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *in_stack_fffffffffffffde8.ptr = '!';
    in_stack_fffffffffffffde0.ptr =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                   (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *in_stack_fffffffffffffde0.ptr = 0xa9;
    in_stack_fffffffffffffdd8 =
         (CBlockIndex *)
         prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                   (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    *(uchar *)&in_stack_fffffffffffffdd8->phashBlock = 0xed;
    puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    this_00 = (CMutableTransaction *)
              base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffd98);
    puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this_00->vin)->
             _M_impl).super__Vector_impl_data._M_start;
    puVar2 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this_00->vin)->
             _M_impl).super__Vector_impl_data._M_finish;
    pCVar3 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)(puVar5 + 0x10) =
         (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this_00->vin)->_M_impl).
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)(puVar5 + 0x18) = pCVar3;
    *(pointer *)puVar5 = puVar1;
    *(pointer *)(puVar5 + 8) = puVar2;
    tx_00 = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd98);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(allocator_type *)tx_00.ptr);
    in_stack_fffffffffffffda8 = local_128;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffda8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffda8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd98)
    ;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffda8,
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_fffffffffffffda8);
    CMutableTransaction::CMutableTransaction(this_00,(CTransaction *)tx_00.ptr);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8,
               (value_type *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    MakeTransactionRef<CMutableTransaction>
              ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))
    ;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffda8,
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::shared_ptr<const_CTransaction>::operator=
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffda8,
               (shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd98);
    CMutableTransaction::~CMutableTransaction(in_stack_fffffffffffffd98);
    CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffffd98);
  }
  UpdateUncommittedBlockStructures
            ((ChainstateManager *)in_stack_fffffffffffffde8.ptr,
             (CBlock *)in_stack_fffffffffffffde0.ptr,in_stack_fffffffffffffdd8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffda8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<unsigned char> ChainstateManager::GenerateCoinbaseCommitment(CBlock& block, const CBlockIndex* pindexPrev) const
{
    std::vector<unsigned char> commitment;
    int commitpos = GetWitnessCommitmentIndex(block);
    std::vector<unsigned char> ret(32, 0x00);
    if (commitpos == NO_WITNESS_COMMITMENT) {
        uint256 witnessroot = BlockWitnessMerkleRoot(block, nullptr);
        CHash256().Write(witnessroot).Write(ret).Finalize(witnessroot);
        CTxOut out;
        out.nValue = 0;
        out.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
        out.scriptPubKey[0] = OP_RETURN;
        out.scriptPubKey[1] = 0x24;
        out.scriptPubKey[2] = 0xaa;
        out.scriptPubKey[3] = 0x21;
        out.scriptPubKey[4] = 0xa9;
        out.scriptPubKey[5] = 0xed;
        memcpy(&out.scriptPubKey[6], witnessroot.begin(), 32);
        commitment = std::vector<unsigned char>(out.scriptPubKey.begin(), out.scriptPubKey.end());
        CMutableTransaction tx(*block.vtx[0]);
        tx.vout.push_back(out);
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
    UpdateUncommittedBlockStructures(block, pindexPrev);
    return commitment;
}